

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearize.c
# Opt level: O0

pseudo_t dmrC_insert_phi_node(dmr_C *C,basic_block *bb,symbol *type)

{
  uint uVar1;
  instruction *def;
  undefined1 local_58 [4];
  opcode op;
  ptr_list_iter insniter__;
  pseudo_t phi;
  instruction *insn;
  instruction *phi_node;
  symbol *type_local;
  basic_block *bb_local;
  dmr_C *C_local;
  
  def = alloc_typed_instruction(C,0x2e,type);
  insniter__._16_8_ = dmrC_alloc_pseudo(C,def);
  (def->field_5).target = (pseudo_t)insniter__._16_8_;
  def->bb = bb;
  ptrlist_forward_iterator((ptr_list_iter *)local_58,(ptr_list *)bb->insns);
  phi = (pseudo_t)ptrlist_iter_next((ptr_list_iter *)local_58);
  while( true ) {
    if (phi == (pseudo_t)0x0) {
      dmrC_add_instruction(C,&bb->insns,def);
      return (pseudo_t)insniter__._16_8_;
    }
    uVar1 = phi->nr & 0xff;
    if ((uVar1 != 1) && (uVar1 != 0x2e)) break;
    phi = (pseudo_t)ptrlist_iter_next((ptr_list_iter *)local_58);
  }
  ptrlist_iter_insert((ptr_list_iter *)local_58,def);
  return (pseudo_t)insniter__._16_8_;
}

Assistant:

pseudo_t dmrC_insert_phi_node(struct dmr_C *C, struct basic_block *bb, struct symbol *type)
{
	struct instruction *phi_node = alloc_typed_instruction(C, OP_PHI, type);
	struct instruction *insn;
	pseudo_t phi;

	phi = dmrC_alloc_pseudo(C, phi_node);
	phi_node->target = phi;
	phi_node->bb = bb;

	FOR_EACH_PTR(bb->insns, insn) {
		enum opcode op = insn->opcode;
		if (op == OP_ENTRY || op == OP_PHI)
			continue;
		INSERT_CURRENT(phi_node, insn);
		return phi;
	} END_FOR_EACH_PTR(insn);

	dmrC_add_instruction(C, &bb->insns, phi_node);
	return phi;
}